

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

void __thiscall
kj::_::
HeapDisposer<kj::_::ImmediatePromiseNode<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>_>
::disposeImpl(HeapDisposer<kj::_::ImmediatePromiseNode<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>_>
              *this,void *pointer)

{
  if (pointer != (void *)0x0) {
    ImmediatePromiseNode<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>::
    ~ImmediatePromiseNode
              ((ImmediatePromiseNode<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>
                *)pointer);
  }
  operator_delete(pointer,0x198);
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }